

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase68::run(TestCase68 *this)

{
  StringPtr *pSVar1;
  HttpHeaderTable *this_00;
  bool bVar2;
  HttpHeaderId *pHVar3;
  HttpHeaderId *extraout_RDX;
  HttpHeaderId *extraout_RDX_00;
  HttpHeaderId *extraout_RDX_01;
  HttpHeaderId *extraout_RDX_02;
  HttpHeaderId *extraout_RDX_03;
  HttpHeaderId *extraout_RDX_04;
  HttpHeaderId *extraout_RDX_05;
  HttpHeaderId *extraout_RDX_06;
  HttpHeaderId *extraout_RDX_07;
  HttpHeaderTable *ptrCopy;
  HttpHeaderId HVar4;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  undefined1 local_b0 [24];
  Builder builder;
  HttpHeaderTable *local_88;
  uint local_80;
  HttpHeaderTable *local_78;
  uint local_70;
  StringPtr local_68;
  Disposer *local_58;
  HttpHeaderTable *local_50;
  uint local_48;
  HttpHeaderTable *local_40;
  uint local_38;
  
  HttpHeaderTable::Builder::Builder(&builder);
  name.content.size_ = 5;
  name.content.ptr = "Host";
  HVar4 = HttpHeaderTable::Builder::add(&builder,name);
  local_78 = HVar4.table;
  local_70 = HVar4.id;
  name_00.content.size_ = 5;
  name_00.content.ptr = "hOsT";
  HVar4 = HttpHeaderTable::Builder::add(&builder,name_00);
  local_40 = HVar4.table;
  local_38 = HVar4.id;
  name_01.content.size_ = 8;
  name_01.content.ptr = "Foo-Bar";
  HVar4 = HttpHeaderTable::Builder::add(&builder,name_01);
  local_88 = HVar4.table;
  local_80 = HVar4.id;
  name_02.content.size_ = 8;
  name_02.content.ptr = "baz-qux";
  HVar4 = HttpHeaderTable::Builder::add(&builder,name_02);
  local_50 = HVar4.table;
  local_48 = HVar4.id;
  name_03.content.size_ = 8;
  name_03.content.ptr = "Baz-Qux";
  HVar4 = HttpHeaderTable::Builder::add(&builder,name_03);
  this_00 = builder.table.ptr;
  local_58 = builder.table.disposer;
  builder.table.ptr = (HttpHeaderTable *)0x0;
  if (((long)(this_00->namesById).builder.pos - (long)(this_00->namesById).builder.ptr &
      0xffffffff0U) != 0x110 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x54,ERROR,"\"failed: expected \" \"table->idCount() == builtinHeaderCount + 2\"",
               (char (*) [60])"failed: expected table->idCount() == builtinHeaderCount + 2");
  }
  if (_::Debug::minSeverity < 3 && local_70 != 0xb) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x56,ERROR,"\"failed: expected \" \"host == HttpHeaderId::HOST\"",
               (char (*) [44])"failed: expected host == HttpHeaderId::HOST");
  }
  if (_::Debug::minSeverity < 3 && local_70 == 0xc) {
    _::Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x57,ERROR,"\"failed: expected \" \"host != HttpHeaderId::DATE\"",
               (char (*) [44])"failed: expected host != HttpHeaderId::DATE");
  }
  if ((local_38 != local_70) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x58,ERROR,"\"failed: expected \" \"host2 == host\"",
               (char (*) [31])"failed: expected host2 == host");
  }
  if ((local_70 == local_80) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5a,ERROR,"\"failed: expected \" \"host != fooBar\"",
               (char (*) [32])"failed: expected host != fooBar");
  }
  pHVar3 = (HttpHeaderId *)(ulong)local_48;
  if ((local_70 == local_48) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[32]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5b,ERROR,"\"failed: expected \" \"host != bazQux\"",
               (char (*) [32])"failed: expected host != bazQux");
    pHVar3 = (HttpHeaderId *)(ulong)local_48;
  }
  if ((local_80 == (uint)pHVar3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5c,ERROR,"\"failed: expected \" \"fooBar != bazQux\"",
               (char (*) [34])"failed: expected fooBar != bazQux");
    pHVar3 = (HttpHeaderId *)(ulong)local_48;
  }
  if (((uint)pHVar3 != HVar4.id) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5d,ERROR,"\"failed: expected \" \"bazQux == bazQux2\"",
               (char (*) [35])"failed: expected bazQux == bazQux2");
    pHVar3 = extraout_RDX;
  }
  str<kj::HttpHeaderId&>((String *)local_b0,(kj *)&local_78,pHVar3);
  local_68.content.ptr = "Host";
  local_68.content.size_ = 5;
  bVar2 = String::operator==((String *)local_b0,&local_68);
  Array<char>::~Array((Array<char> *)local_b0);
  pHVar3 = extraout_RDX_00;
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x5f,ERROR,"\"failed: expected \" \"kj::str(host) == \\\"Host\\\"\"",
               (char (*) [41])"failed: expected kj::str(host) == \"Host\"");
    pHVar3 = extraout_RDX_01;
  }
  str<kj::HttpHeaderId&>((String *)local_b0,(kj *)&local_40,pHVar3);
  local_68.content.ptr = "Host";
  local_68.content.size_ = 5;
  bVar2 = String::operator==((String *)local_b0,&local_68);
  Array<char>::~Array((Array<char> *)local_b0);
  pHVar3 = extraout_RDX_02;
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x60,ERROR,"\"failed: expected \" \"kj::str(host2) == \\\"Host\\\"\"",
               (char (*) [42])"failed: expected kj::str(host2) == \"Host\"");
    pHVar3 = extraout_RDX_03;
  }
  str<kj::HttpHeaderId&>((String *)local_b0,(kj *)&local_88,pHVar3);
  local_68.content.ptr = "Foo-Bar";
  local_68.content.size_ = 8;
  bVar2 = String::operator==((String *)local_b0,&local_68);
  Array<char>::~Array((Array<char> *)local_b0);
  pHVar3 = extraout_RDX_04;
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x61,ERROR,"\"failed: expected \" \"kj::str(fooBar) == \\\"Foo-Bar\\\"\"",
               (char (*) [46])"failed: expected kj::str(fooBar) == \"Foo-Bar\"");
    pHVar3 = extraout_RDX_05;
  }
  str<kj::HttpHeaderId&>((String *)local_b0,(kj *)&local_50,pHVar3);
  local_68.content.ptr = "baz-qux";
  local_68.content.size_ = 8;
  bVar2 = String::operator==((String *)local_b0,&local_68);
  Array<char>::~Array((Array<char> *)local_b0);
  pHVar3 = extraout_RDX_06;
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x62,ERROR,"\"failed: expected \" \"kj::str(bazQux) == \\\"baz-qux\\\"\"",
               (char (*) [46])"failed: expected kj::str(bazQux) == \"baz-qux\"");
    pHVar3 = extraout_RDX_07;
  }
  str<kj::HttpHeaderId_const&>((String *)local_b0,(kj *)&HttpHeaderId::HOST,pHVar3);
  local_68.content.ptr = "Host";
  local_68.content.size_ = 5;
  bVar2 = String::operator==((String *)local_b0,&local_68);
  Array<char>::~Array((Array<char> *)local_b0);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,99,ERROR,"\"failed: expected \" \"kj::str(HttpHeaderId::HOST) == \\\"Host\\\"\"",
               (char (*) [55])"failed: expected kj::str(HttpHeaderId::HOST) == \"Host\"");
  }
  pSVar1 = (this_00->namesById).builder.ptr;
  local_b0._0_8_ = pSVar1[0xc].content.ptr;
  local_b0._8_8_ = pSVar1[0xc].content.size_;
  local_68.content.ptr = "Date";
  local_68.content.size_ = 5;
  bVar2 = StringPtr::operator==((StringPtr *)local_b0,&local_68);
  if ((!bVar2) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"table->idToString(HttpHeaderId::DATE) == \\\"Date\\\"\"",
               (char (*) [65])"failed: expected table->idToString(HttpHeaderId::DATE) == \"Date\"");
  }
  pSVar1 = (this_00->namesById).builder.ptr + local_80;
  local_b0._0_8_ = (pSVar1->content).ptr;
  local_b0._8_8_ = (pSVar1->content).size_;
  local_68.content.ptr = "Foo-Bar";
  local_68.content.size_ = 8;
  bVar2 = StringPtr::operator==((StringPtr *)local_b0,&local_68);
  if ((!bVar2) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x66,ERROR,"\"failed: expected \" \"table->idToString(fooBar) == \\\"Foo-Bar\\\"\"",
               (char (*) [56])"failed: expected table->idToString(fooBar) == \"Foo-Bar\"");
  }
  name_04.content.size_ = 5;
  name_04.content.ptr = "Date";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_b0,this_00,name_04);
  if (local_b0[0] != true) {
    _::Debug::Fault::Fault
              ((Fault *)local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x68,FAILED,"table->stringToId(\"Date\") != nullptr","");
    _::Debug::Fault::fatal((Fault *)local_b0);
  }
  if ((local_b0._16_4_ != 0xc) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[84]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x68,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"Date\\\")) == HttpHeaderId::DATE\""
               ,(char (*) [84])
                "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"Date\")) == HttpHeaderId::DATE"
              );
  }
  name_05.content.size_ = 5;
  name_05.content.ptr = "dATE";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_b0,this_00,name_05);
  if (local_b0[0] != true) {
    _::Debug::Fault::Fault
              ((Fault *)local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x69,FAILED,"table->stringToId(\"dATE\") != nullptr","");
    _::Debug::Fault::fatal((Fault *)local_b0);
  }
  if ((local_b0._16_4_ != 0xc) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[84]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x69,ERROR,
               "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"dATE\\\")) == HttpHeaderId::DATE\""
               ,(char (*) [84])
                "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"dATE\")) == HttpHeaderId::DATE"
              );
  }
  name_06.content.size_ = 8;
  name_06.content.ptr = "Foo-Bar";
  HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_b0,this_00,name_06);
  if (local_b0[0] == true) {
    if ((local_b0._16_4_ != local_80) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[75]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"Foo-Bar\\\")) == fooBar\""
                 ,(char (*) [75])
                  "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"Foo-Bar\")) == fooBar");
    }
    name_07.content.size_ = 8;
    name_07.content.ptr = "foo-BAR";
    HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_b0,this_00,name_07);
    if (local_b0[0] == true) {
      if ((local_b0._16_4_ != local_80) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[75]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x6b,ERROR,
                   "\"failed: expected \" \"KJ_ASSERT_NONNULL(table->stringToId(\\\"foo-BAR\\\")) == fooBar\""
                   ,(char (*) [75])
                    "failed: expected KJ_ASSERT_NONNULL(table->stringToId(\"foo-BAR\")) == fooBar");
      }
      name_08.content.size_ = 7;
      name_08.content.ptr = "foobar";
      HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_b0,this_00,name_08);
      if ((local_b0[0] == true) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[56]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x6c,ERROR,
                   "\"failed: expected \" \"table->stringToId(\\\"foobar\\\") == nullptr\"",
                   (char (*) [56])"failed: expected table->stringToId(\"foobar\") == nullptr");
      }
      name_09.content.size_ = 7;
      name_09.content.ptr = "barfoo";
      HttpHeaderTable::stringToId((Maybe<kj::HttpHeaderId> *)local_b0,this_00,name_09);
      if ((local_b0[0] == true) && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[56]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                   ,0x6d,ERROR,
                   "\"failed: expected \" \"table->stringToId(\\\"barfoo\\\") == nullptr\"",
                   (char (*) [56])"failed: expected table->stringToId(\"barfoo\") == nullptr");
      }
      (**local_58->_vptr_Disposer)(local_58,this_00);
      if (builder.table.ptr != (HttpHeaderTable *)0x0) {
        builder.table.ptr = (HttpHeaderTable *)0x0;
        (**(builder.table.disposer)->_vptr_Disposer)();
      }
      return;
    }
    _::Debug::Fault::Fault
              ((Fault *)local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x6b,FAILED,"table->stringToId(\"foo-BAR\") != nullptr","");
    _::Debug::Fault::fatal((Fault *)local_b0);
  }
  _::Debug::Fault::Fault
            ((Fault *)local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
             ,0x6a,FAILED,"table->stringToId(\"Foo-Bar\") != nullptr","");
  _::Debug::Fault::fatal((Fault *)local_b0);
}

Assistant:

TEST(AsyncUnixTest, Signals) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  kill(getpid(), SIGURG);

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_USER, info.si_code);
}